

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

PyObject * libxml_xmlFreeValidCtxt(PyObject *self,PyObject *args)

{
  long *plVar1;
  undefined8 *puVar2;
  int iVar3;
  long in_RAX;
  PyObject *pPVar4;
  PyObject *pyobj_cur;
  long local_18;
  
  pPVar4 = (PyObject *)0x0;
  local_18 = in_RAX;
  iVar3 = _PyArg_ParseTuple_SizeT(args,"O:xmlFreeValidCtxt",&local_18);
  if (iVar3 != 0) {
    plVar1 = *(long **)(local_18 + 0x10);
    puVar2 = (undefined8 *)*plVar1;
    if (puVar2 != (undefined8 *)0x0) {
      _Py_XDECREF((PyObject *)puVar2[1]);
      _Py_XDECREF((PyObject *)*puVar2);
      _Py_XDECREF((PyObject *)puVar2[2]);
      (*_xmlFree)(puVar2);
    }
    xmlFreeValidCtxt(plVar1);
    pPVar4 = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  return pPVar4;
}

Assistant:

static PyObject *
libxml_xmlFreeValidCtxt(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    xmlValidCtxtPtr cur;
    xmlValidCtxtPyCtxtPtr pyCtxt;
    PyObject *pyobj_cur;

    if (!PyArg_ParseTuple(args, (char *)"O:xmlFreeValidCtxt", &pyobj_cur))
        return(NULL);
    cur = (xmlValidCtxtPtr) PyValidCtxt_Get(pyobj_cur);

    pyCtxt = (xmlValidCtxtPyCtxtPtr)(cur->userData);
    if (pyCtxt != NULL)
    {
            Py_XDECREF(pyCtxt->error);
            Py_XDECREF(pyCtxt->warn);
            Py_XDECREF(pyCtxt->arg);
            xmlFree(pyCtxt);
    }

    xmlFreeValidCtxt(cur);
    Py_INCREF(Py_None);
    return(Py_None);
}